

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O1

Argument * __thiscall
argparse::ArgumentParser::add_argument<char_const*,char_const*>
          (ArgumentParser *this,char *Fargs,char *Fargs_1)

{
  size_t *psVar1;
  size_t sVar2;
  list_iterator argIt;
  __off64_t *in_R8;
  size_t in_R9;
  uint __flags;
  
  sVar2 = strlen(Fargs);
  __flags = (uint)sVar2;
  strlen(Fargs_1);
  argIt._M_node =
       &std::__cxx11::list<argparse::Argument,std::allocator<argparse::Argument>>::
        _M_create_node<std::basic_string_view<char,std::char_traits<char>>[2]>
                  ((list<argparse::Argument,std::allocator<argparse::Argument>> *)
                   &this->mOptionalArguments,
                   (basic_string_view<char,_std::char_traits<char>_> (*) [2])
                   &stack0xffffffffffffffb8)->super__List_node_base;
  std::__detail::_List_node_base::_M_hook(argIt._M_node);
  psVar1 = &(this->mOptionalArguments).
            super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl.
            _M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (((ulong)argIt._M_node[0xd]._M_prev & 0x100000000) == 0) {
    std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::splice
              (&this->mPositionalArguments,(int)&this->mPositionalArguments,
               (__off64_t *)&this->mOptionalArguments,(int)argIt._M_node,in_R8,in_R9,__flags);
  }
  index_argument(this,argIt);
  return (Argument *)(argIt._M_node + 1);
}

Assistant:

Argument &add_argument(Targs... Fargs) {
            using array_of_sv = std::string_view[sizeof...(Targs)];
            auto tArgument = mOptionalArguments.emplace(cend(mOptionalArguments),
                                                        array_of_sv{Fargs...});

            if (!tArgument->mIsOptional)
                mPositionalArguments.splice(cend(mPositionalArguments),
                                            mOptionalArguments, tArgument);

            index_argument(tArgument);
            return *tArgument;
        }